

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_list_path_stroke
               (nk_draw_list *list,nk_color color,nk_draw_list_stroke closed,float thickness)

{
  long in_RDI;
  nk_vec2 *points;
  nk_anti_aliasing in_stack_00000480;
  float in_stack_00000484;
  nk_draw_list_stroke in_stack_00000488;
  uint in_stack_0000048c;
  nk_vec2 *in_stack_00000490;
  nk_draw_list *in_stack_00000498;
  nk_color in_stack_000004a4;
  
  if (in_RDI != 0) {
    nk_buffer_memory(*(nk_buffer **)(in_RDI + 0xb0));
    nk_draw_list_stroke_poly_line
              (in_stack_00000498,in_stack_00000490,in_stack_0000048c,in_stack_000004a4,
               in_stack_00000488,in_stack_00000484,in_stack_00000480);
    nk_draw_list_path_clear((nk_draw_list *)0x112a73);
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_path_stroke(struct nk_draw_list *list, struct nk_color color,
enum nk_draw_list_stroke closed, float thickness)
{
struct nk_vec2 *points;
NK_ASSERT(list);
if (!list) return;
points = (struct nk_vec2*)nk_buffer_memory(list->buffer);
nk_draw_list_stroke_poly_line(list, points, list->path_count, color,
closed, thickness, list->config.line_AA);
nk_draw_list_path_clear(list);
}